

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_intersects(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  bitset_t *pbVar6;
  bitset_t *pbVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint64_t uVar12;
  int i;
  undefined8 unaff_R12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong unaff_R15;
  ulong auStack_a0 [4];
  bitset_t *pbStack_80;
  bitset_t *pbStack_78;
  code *pcStack_70;
  bitset_t *pbStack_60;
  undefined8 uStack_58;
  bitset_t *pbStack_50;
  code *pcStack_48;
  bitset_t *pbStack_38;
  bitset_t *pbStack_30;
  
  pbStack_30 = (bitset_t *)0x102245;
  pbVar5 = bitset_create();
  pbStack_30 = (bitset_t *)0x10224d;
  pbVar6 = bitset_create();
  pbStack_30 = (bitset_t *)0x102258;
  _Var4 = bitset_empty(pbVar5);
  if (_Var4) {
    uVar13 = 0;
    do {
      uVar14 = uVar13 >> 6;
      if ((uVar13 & 1) == 0) {
        unaff_R15 = 0x3e;
        pbVar7 = pbVar5;
        if (uVar14 < pbVar5->arraysize) goto LAB_001022b6;
        pbStack_30 = (bitset_t *)0x10229e;
        _Var4 = bitset_grow(pbVar5,uVar14 + 1);
LAB_001022b2:
        if (_Var4 != false) goto LAB_001022b6;
      }
      else {
        unaff_R15 = 0x3f;
        pbVar7 = pbVar6;
        if (pbVar6->arraysize <= uVar14) {
          pbStack_30 = (bitset_t *)0x1022af;
          _Var4 = bitset_grow(pbVar6,uVar14 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar16 = (uint)unaff_R15 & (uint)uVar13;
        unaff_R15 = (ulong)uVar16;
        pbVar7->array[uVar14] = pbVar7->array[uVar14] | 1L << (sbyte)uVar16;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 1000);
    pbStack_30 = (bitset_t *)0x1022e2;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    unaff_R12 = 1000;
    if (_Var4) goto LAB_0010235b;
    unaff_R15 = 0x20000000000;
    if (pbVar5->arraysize < 0x10) {
      pbStack_30 = (bitset_t *)0x102304;
      _Var4 = bitset_grow(pbVar5,0x10);
      if (_Var4) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar5->array[0xf] = pbVar5->array[0xf] | 0x20000000000;
    }
    if (pbVar6->arraysize < 0x10) {
      pbStack_30 = (bitset_t *)0x102323;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pbStack_30 = (bitset_t *)0x102339;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    if (_Var4) {
      pbStack_30 = (bitset_t *)0x102345;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pbStack_30 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_30 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_30 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_48 = (code *)0x102373;
  pbStack_38 = pbVar5;
  pbStack_30 = pbVar6;
  pbVar5 = bitset_create_with_capacity(10);
  pcStack_48 = (code *)0x102380;
  pbVar6 = bitset_create_with_capacity(5);
  if (pbVar5->arraysize == 0) {
    pcStack_48 = (code *)0x102397;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar5->array = *pbVar5->array | 2;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_48 = (code *)0x1023b6;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar5->array = *pbVar5->array | 0x10;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_48 = (code *)0x1023d5;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar5->array = *pbVar5->array | 0x40;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_48 = (code *)0x1023f4;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar6->array = *pbVar6->array | 2;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_48 = (code *)0x102413;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar6->array = *pbVar6->array | 0x10;
  }
  pcStack_48 = (code *)0x102429;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_48 = (code *)0x102438;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (!_Var4) {
      pcStack_48 = (code *)0x102444;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_48 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_48 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_70 = (code *)0x10246a;
  pbStack_60 = pbVar5;
  uStack_58 = unaff_R12;
  pbStack_50 = pbVar6;
  pcStack_48 = (code *)unaff_R15;
  pbVar5 = bitset_create();
  uVar13 = 0;
  pcStack_70 = (code *)0x102475;
  pbVar6 = bitset_create();
  do {
    uVar14 = uVar13 >> 6;
    if (uVar14 < pbVar5->arraysize) {
LAB_00102496:
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      pcStack_70 = (code *)0x102492;
      _Var4 = bitset_grow(pbVar5,uVar14 + 1);
      if (_Var4) goto LAB_00102496;
    }
    if ((uVar13 & 1) == 0) {
      if (pbVar6->arraysize <= uVar14) {
        pcStack_70 = (code *)0x1024c1;
        _Var4 = bitset_grow(pbVar6,uVar14 + 1);
        if (!_Var4) goto LAB_001024da;
      }
      pbVar6->array[uVar14] = pbVar6->array[uVar14] | 1L << ((byte)uVar13 & 0x3e);
    }
LAB_001024da:
    uVar13 = uVar13 + 1;
  } while (uVar13 != 1000);
  pcStack_70 = (code *)0x1024f1;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_70 = (code *)0x102500;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (_Var4) goto LAB_0010256b;
    if (pbVar6->arraysize < 0x10) {
      pcStack_70 = (code *)0x102518;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pcStack_70 = (code *)0x102538;
    _Var4 = bitset_contains_all(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_70 = (code *)0x102547;
      _Var4 = bitset_contains_all(pbVar6,pbVar5);
      if (!_Var4) {
        pcStack_70 = (code *)0x102553;
        bitset_free(pbVar5);
        bitset_free(pbVar6);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_70 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_70 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_70 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_70 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar14 = 0;
  pbStack_80 = pbVar5;
  pbStack_78 = pbVar6;
  pcStack_70 = (code *)uVar13;
  pbVar5 = bitset_create();
  do {
    uVar13 = uVar14 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar14 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 100);
  uVar13 = 0x3e6;
  do {
    uVar13 = uVar13 + 2;
    uVar14 = uVar13 >> 6;
    if (uVar14 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar13 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar14 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar13 < 0x44a);
  uVar13 = pbVar5->arraysize;
  uVar14 = 0;
  lVar10 = 0;
LAB_0010261a:
  uVar9 = uVar14 >> 6;
  if (uVar9 < uVar13) {
    puVar1 = pbVar5->array;
    uVar12 = (puVar1[uVar9] >> ((byte)uVar14 & 0x3f)) << ((byte)uVar14 & 0x3f);
    uVar11 = uVar14 & 0xffffffffffffffc0;
    uVar8 = 0;
    do {
      while (uVar12 == 0) {
        uVar9 = uVar9 + 1;
        if (uVar9 == uVar13) goto LAB_0010268b;
        uVar11 = uVar11 + 0x40;
        uVar12 = puVar1[uVar9];
        if (2 < uVar8) goto LAB_0010268b;
      }
      uVar15 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      auStack_a0[uVar8] = uVar15 | uVar11;
      uVar15 = uVar12 - 1;
      if (uVar8 == 2) {
        uVar15 = 0xffffffffffffffff;
      }
      uVar8 = uVar8 + 1;
      uVar12 = uVar12 & uVar15;
    } while (uVar8 != 3);
    uVar8 = 3;
LAB_0010268b:
    if (uVar8 != 0) {
      uVar14 = auStack_a0[uVar8 - 1];
    }
  }
  else {
    uVar8 = 0;
  }
  if (uVar8 != 0) {
    uVar9 = lVar10 * 2 + 800;
    uVar11 = 0;
    do {
      uVar15 = lVar10 + uVar11;
      if (99 < lVar10 + uVar11) {
        uVar15 = uVar9;
      }
      if (auStack_a0[uVar11] != uVar15) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + 2;
    } while (uVar8 != uVar11);
    uVar14 = uVar14 + 1;
    lVar10 = uVar8 + lVar10;
    goto LAB_0010261a;
  }
  if (lVar10 == 0x96) {
    bitset_free(pbVar5);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar13 = 0;
  pbVar5 = bitset_create();
  do {
    uVar14 = uVar13 >> 6;
    if ((uVar14 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar14 + 1), _Var4)) {
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar13 & 0x3f);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  uVar13 = 0x3e6;
  do {
    uVar13 = uVar13 + 2;
    uVar14 = uVar13 >> 6;
    if ((uVar14 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar14 + 1), _Var4)) {
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar13 & 0x3e);
    }
  } while (uVar13 < 0x44a);
  uVar13 = 0;
  uVar14 = 0;
  do {
    uVar9 = uVar13 >> 6;
    if (uVar9 < pbVar5->arraysize) {
      uVar8 = pbVar5->array[uVar9] >> ((byte)uVar13 & 0x3f);
      if (uVar8 == 0) {
        lVar10 = uVar9 * -0x40;
        do {
          uVar9 = uVar9 + 1;
          if (pbVar5->arraysize == uVar9) goto LAB_001027e0;
          uVar8 = pbVar5->array[uVar9];
          lVar10 = lVar10 + -0x40;
        } while (uVar8 == 0);
        lVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar13 = lVar2 - lVar10;
      }
      else {
        lVar10 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
          }
        }
        uVar13 = uVar13 + lVar10;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar14 == 0x96) {
        bitset_free(pbVar5);
        return;
      }
      goto LAB_00102822;
    }
    uVar9 = uVar14 * 2 + 800;
    if (uVar14 < 100) {
      uVar9 = uVar14;
    }
    if (uVar13 != uVar9) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar14 = uVar14 + 1;
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void test_intersects() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();
  TEST_ASSERT(bitset_empty(evens));

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(!bitsets_intersect(evens, odds));

  bitset_set(evens, 1001);
  bitset_set(odds, 1001);

  TEST_ASSERT(bitsets_intersect(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}